

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

wchar_t * __thiscall
duckdb_fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  byte bVar14;
  int i_1;
  char *pcVar15;
  int i;
  int iVar16;
  char *pcVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar32 [16];
  
  auVar4 = _DAT_01d9abd0;
  auVar3 = _DAT_01d99b10;
  auVar2 = _DAT_01d99b00;
  uVar8 = this->num_digits_;
  uVar9 = (ulong)uVar8;
  uVar10 = this->exp_;
  uVar12 = (ulong)uVar10;
  uVar5 = uVar10 + uVar8;
  uVar11 = *(uint *)&(this->specs_).field_0x4;
  if ((char)uVar11 == '\x01') {
    pcVar15 = this->digits_;
    *it = (int)*pcVar15;
    uVar10 = (this->specs_).precision - uVar8;
    bVar14 = (byte)((uint)*(undefined4 *)&(this->specs_).field_0x4 >> 0x1d) & 1 & 0 < (int)uVar10;
    if (((int)uVar8 < 2) && (bVar14 == 0)) {
      pwVar6 = it + 1;
    }
    else {
      pwVar6 = it + 2;
      it[1] = this->decimal_point_;
      if (1 < (int)uVar8) {
        do {
          pcVar15 = pcVar15 + 1;
          uVar9 = uVar9 - 1;
          *pwVar6 = (int)*pcVar15;
          pwVar6 = pwVar6 + 1;
        } while (1 < uVar9);
      }
    }
    auVar4 = _DAT_01d9abd0;
    auVar3 = _DAT_01d99b10;
    auVar2 = _DAT_01d99b00;
    pwVar7 = pwVar6;
    if (bVar14 != 0) {
      pwVar7 = pwVar6 + uVar10;
      uVar9 = (ulong)uVar10 + 0x3fffffffffffffff;
      uVar12 = uVar9 & 0x3fffffffffffffff;
      auVar18._8_4_ = (int)uVar12;
      auVar18._0_8_ = uVar12;
      auVar18._12_4_ = (int)(uVar12 >> 0x20);
      lVar13 = 0;
      auVar18 = auVar18 ^ _DAT_01d99b10;
      do {
        auVar27._8_4_ = (int)lVar13;
        auVar27._0_8_ = lVar13;
        auVar27._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar32 = (auVar27 | auVar2) ^ auVar3;
        iVar16 = auVar18._4_4_;
        if ((bool)(~(auVar32._4_4_ == iVar16 && auVar18._0_4_ < auVar32._0_4_ ||
                    iVar16 < auVar32._4_4_) & 1)) {
          pwVar6[lVar13] = L'0';
        }
        if ((auVar32._12_4_ != auVar18._12_4_ || auVar32._8_4_ <= auVar18._8_4_) &&
            auVar32._12_4_ <= auVar18._12_4_) {
          pwVar6[lVar13 + 1] = L'0';
        }
        auVar27 = (auVar27 | auVar4) ^ auVar3;
        iVar24 = auVar27._4_4_;
        if (iVar24 <= iVar16 && (iVar24 != iVar16 || auVar27._0_4_ <= auVar18._0_4_)) {
          pwVar6[lVar13 + 2] = L'0';
          pwVar6[lVar13 + 3] = L'0';
        }
        lVar13 = lVar13 + 4;
      } while ((uVar12 - ((uint)uVar9 & 3)) + 4 != lVar13);
    }
    *pwVar7 = (uint)((*(uint *)&(this->specs_).field_0x4 >> 0x18 & 1) == 0) << 5 | 0x45;
    pwVar6 = write_exponent<wchar_t,wchar_t*>(uVar5 - 1,pwVar7 + 1);
    return pwVar6;
  }
  if (-1 < (int)uVar10) {
    if ((int)uVar5 < 4 || (uVar11 & 0xff0000) == 0) {
      if (0 < (int)uVar8) {
        pcVar15 = this->digits_;
        uVar9 = uVar9 + 1;
        do {
          *it = (int)*pcVar15;
          pcVar15 = pcVar15 + 1;
          it = it + 1;
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
      }
      auVar4 = _DAT_01d9abd0;
      auVar3 = _DAT_01d99b10;
      auVar2 = _DAT_01d99b00;
      pwVar6 = it;
      if (uVar12 != 0) {
        uVar9 = uVar12 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar32._8_4_ = (int)uVar9;
        auVar32._0_8_ = uVar9;
        auVar32._12_4_ = (int)(uVar9 >> 0x20);
        lVar13 = 0;
        auVar32 = auVar32 ^ _DAT_01d99b10;
        do {
          auVar28._8_4_ = (int)lVar13;
          auVar28._0_8_ = lVar13;
          auVar28._12_4_ = (int)((ulong)lVar13 >> 0x20);
          auVar18 = (auVar28 | auVar2) ^ auVar3;
          iVar16 = auVar32._4_4_;
          if ((bool)(~(auVar18._4_4_ == iVar16 && auVar32._0_4_ < auVar18._0_4_ ||
                      iVar16 < auVar18._4_4_) & 1)) {
            it[lVar13] = L'0';
          }
          if ((auVar18._12_4_ != auVar32._12_4_ || auVar18._8_4_ <= auVar32._8_4_) &&
              auVar18._12_4_ <= auVar32._12_4_) {
            it[lVar13 + 1] = L'0';
          }
          auVar18 = (auVar28 | auVar4) ^ auVar3;
          iVar24 = auVar18._4_4_;
          if (iVar24 <= iVar16 && (iVar24 != iVar16 || auVar18._0_4_ <= auVar32._0_4_)) {
            it[lVar13 + 2] = L'0';
            it[lVar13 + 3] = L'0';
          }
          lVar13 = lVar13 + 4;
          pwVar6 = it + uVar12;
        } while ((uVar9 - ((uint)(uVar12 + 0x3fffffffffffffff) & 3)) + 4 != lVar13);
      }
    }
    else {
      uVar10 = 3;
      if (uVar5 % 3 != 0) {
        uVar10 = uVar5 % 3;
      }
      pcVar15 = this->digits_;
      iVar16 = 0;
      do {
        if (0 < iVar16) {
          *it = (int)(char)(this->specs_).field_0x6;
          it = it + 1;
        }
        uVar11 = uVar8 - iVar16;
        if (uVar11 == 0 || (int)uVar8 < iVar16) {
          uVar9 = (ulong)uVar10 + 0x3fffffffffffffff;
          uVar12 = uVar9 & 0x3fffffffffffffff;
          auVar23._8_4_ = (int)uVar12;
          auVar23._0_8_ = uVar12;
          auVar23._12_4_ = (int)(uVar12 >> 0x20);
          lVar13 = 0;
          do {
            auVar26._8_4_ = (int)lVar13;
            auVar26._0_8_ = lVar13;
            auVar26._12_4_ = (int)((ulong)lVar13 >> 0x20);
            auVar18 = auVar23 ^ auVar3;
            auVar27 = (auVar26 | auVar2) ^ auVar3;
            iVar24 = auVar18._4_4_;
            if ((bool)(~(iVar24 < auVar27._4_4_ ||
                        auVar18._0_4_ < auVar27._0_4_ && auVar27._4_4_ == iVar24) & 1)) {
              it[lVar13] = L'0';
            }
            if (auVar27._12_4_ <= auVar18._12_4_ &&
                (auVar27._8_4_ <= auVar18._8_4_ || auVar27._12_4_ != auVar18._12_4_)) {
              it[lVar13 + 1] = L'0';
            }
            auVar27 = (auVar26 | auVar4) ^ auVar3;
            iVar33 = auVar27._4_4_;
            if (iVar33 <= iVar24 && (iVar33 != iVar24 || auVar27._0_4_ <= auVar18._0_4_)) {
              it[lVar13 + 2] = L'0';
              it[lVar13 + 3] = L'0';
            }
            lVar13 = lVar13 + 4;
            pwVar6 = it + uVar10;
          } while ((uVar12 - ((uint)uVar9 & 3)) + 4 != lVar13);
        }
        else {
          uVar1 = uVar11;
          if ((int)uVar10 < (int)uVar11) {
            uVar1 = uVar10;
          }
          if (0 < (int)uVar11) {
            pcVar17 = pcVar15 + iVar16;
            uVar9 = (long)(int)uVar1 + 1;
            do {
              *it = (int)*pcVar17;
              pcVar17 = pcVar17 + 1;
              it = it + 1;
              uVar9 = uVar9 - 1;
            } while (1 < uVar9);
          }
          pwVar6 = it;
          if (((int)uVar11 < (int)uVar10) &&
             (uVar11 = uVar10 - uVar1, uVar11 != 0 && (int)uVar1 <= (int)uVar10)) {
            uVar9 = (ulong)uVar11 + 0x3fffffffffffffff;
            uVar12 = uVar9 & 0x3fffffffffffffff;
            auVar22._8_4_ = (int)uVar12;
            auVar22._0_8_ = uVar12;
            auVar22._12_4_ = (int)(uVar12 >> 0x20);
            auVar22 = auVar22 ^ auVar3;
            lVar13 = 0;
            do {
              auVar25._8_4_ = (int)lVar13;
              auVar25._0_8_ = lVar13;
              auVar25._12_4_ = (int)((ulong)lVar13 >> 0x20);
              auVar18 = (auVar25 | auVar2) ^ auVar3;
              iVar24 = auVar22._4_4_;
              if ((bool)(~(iVar24 < auVar18._4_4_ ||
                          auVar22._0_4_ < auVar18._0_4_ && auVar18._4_4_ == iVar24) & 1)) {
                it[lVar13] = L'0';
              }
              if (auVar18._12_4_ <= auVar22._12_4_ &&
                  (auVar18._8_4_ <= auVar22._8_4_ || auVar18._12_4_ != auVar22._12_4_)) {
                it[lVar13 + 1] = L'0';
              }
              auVar18 = (auVar25 | auVar4) ^ auVar3;
              iVar33 = auVar18._4_4_;
              if (iVar33 <= iVar24 && (iVar33 != iVar24 || auVar18._0_4_ <= auVar22._0_4_)) {
                it[lVar13 + 2] = L'0';
                it[lVar13 + 3] = L'0';
              }
              lVar13 = lVar13 + 4;
              pwVar6 = it + uVar11;
            } while ((uVar12 - ((uint)uVar9 & 3)) + 4 != lVar13);
          }
        }
        it = pwVar6;
        iVar16 = iVar16 + uVar10;
        uVar10 = 3;
        pwVar6 = it;
      } while (iVar16 < (int)uVar5);
    }
    if (((this->specs_).field_0x7 & 0x20) == 0) {
      return pwVar6;
    }
    *pwVar6 = this->decimal_point_;
    auVar4 = _DAT_01d9abd0;
    auVar3 = _DAT_01d99b10;
    auVar2 = _DAT_01d99b00;
    iVar16 = (this->specs_).precision;
    uVar8 = iVar16 - uVar5;
    if (uVar8 != 0 && (int)uVar5 <= iVar16) {
      uVar9 = (ulong)uVar8 + 0x3fffffffffffffff;
      uVar12 = uVar9 & 0x3fffffffffffffff;
      auVar19._8_4_ = (int)uVar12;
      auVar19._0_8_ = uVar12;
      auVar19._12_4_ = (int)(uVar12 >> 0x20);
      lVar13 = 0;
      auVar19 = auVar19 ^ _DAT_01d99b10;
      do {
        auVar29._8_4_ = (int)lVar13;
        auVar29._0_8_ = lVar13;
        auVar29._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar18 = (auVar29 | auVar2) ^ auVar3;
        iVar16 = auVar19._4_4_;
        if ((bool)(~(auVar18._4_4_ == iVar16 && auVar19._0_4_ < auVar18._0_4_ ||
                    iVar16 < auVar18._4_4_) & 1)) {
          pwVar6[lVar13 + 1] = L'0';
        }
        if ((auVar18._12_4_ != auVar19._12_4_ || auVar18._8_4_ <= auVar19._8_4_) &&
            auVar18._12_4_ <= auVar19._12_4_) {
          pwVar6[lVar13 + 2] = L'0';
        }
        auVar18 = (auVar29 | auVar4) ^ auVar3;
        iVar24 = auVar18._4_4_;
        if (iVar24 <= iVar16 && (iVar24 != iVar16 || auVar18._0_4_ <= auVar19._0_4_)) {
          pwVar6[lVar13 + 3] = L'0';
          pwVar6[lVar13 + 4] = L'0';
        }
        lVar13 = lVar13 + 4;
      } while ((uVar12 - ((uint)uVar9 & 3)) + 4 != lVar13);
      return pwVar6 + 1 + uVar8;
    }
    if ((this->specs_).field_0x4 == '\x02') {
      return pwVar6 + 1;
    }
    pwVar6[1] = L'0';
    return pwVar6 + 2;
  }
  if (0 < (int)uVar5) {
    if (uVar5 < 4 || (uVar11 & 0xff0000) == 0) {
      pcVar15 = this->digits_;
      uVar9 = (ulong)uVar5 + 1;
      do {
        *it = (int)*pcVar15;
        pcVar15 = pcVar15 + 1;
        it = it + 1;
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
    }
    else {
      uVar10 = 3;
      if (uVar5 % 3 != 0) {
        uVar10 = uVar5 % 3;
      }
      pcVar15 = this->digits_;
      iVar16 = 0;
      do {
        if (0 < iVar16) {
          *it = (int)(char)(this->specs_).field_0x6;
          it = it + 1;
        }
        pcVar17 = pcVar15 + iVar16;
        uVar9 = (ulong)uVar10 + 1;
        do {
          *it = (int)*pcVar17;
          pcVar17 = pcVar17 + 1;
          it = it + 1;
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
        iVar16 = iVar16 + uVar10;
        uVar10 = 3;
      } while (iVar16 < (int)uVar5);
    }
    lVar13 = (long)(int)uVar8;
    if (((this->specs_).field_0x7 & 0x20) != 0) {
      *it = this->decimal_point_;
      pwVar6 = it + 1;
      uVar9 = (ulong)uVar5;
      if (lVar13 - uVar9 != 0 && (long)uVar9 <= lVar13) {
        pcVar15 = this->digits_ + uVar9;
        uVar9 = (lVar13 - uVar9) + 1;
        do {
          *pwVar6 = (int)*pcVar15;
          pcVar15 = pcVar15 + 1;
          pwVar6 = pwVar6 + 1;
          uVar9 = uVar9 - 1;
        } while (1 < uVar9);
      }
      auVar4 = _DAT_01d9abd0;
      auVar3 = _DAT_01d99b10;
      auVar2 = _DAT_01d99b00;
      iVar16 = (this->specs_).precision;
      uVar10 = iVar16 - uVar8;
      if (uVar10 == 0 || iVar16 < (int)uVar8) {
        return pwVar6;
      }
      if (uVar10 == 0 || iVar16 < (int)uVar8) {
        return pwVar6;
      }
      uVar9 = (ulong)uVar10 + 0x3fffffffffffffff;
      uVar12 = uVar9 & 0x3fffffffffffffff;
      auVar20._8_4_ = (int)uVar12;
      auVar20._0_8_ = uVar12;
      auVar20._12_4_ = (int)(uVar12 >> 0x20);
      lVar13 = 0;
      auVar20 = auVar20 ^ _DAT_01d99b10;
      do {
        auVar30._8_4_ = (int)lVar13;
        auVar30._0_8_ = lVar13;
        auVar30._12_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar18 = (auVar30 | auVar2) ^ auVar3;
        iVar16 = auVar20._4_4_;
        if ((bool)(~(auVar18._4_4_ == iVar16 && auVar20._0_4_ < auVar18._0_4_ ||
                    iVar16 < auVar18._4_4_) & 1)) {
          pwVar6[lVar13] = L'0';
        }
        if ((auVar18._12_4_ != auVar20._12_4_ || auVar18._8_4_ <= auVar20._8_4_) &&
            auVar18._12_4_ <= auVar20._12_4_) {
          pwVar6[lVar13 + 1] = L'0';
        }
        auVar18 = (auVar30 | auVar4) ^ auVar3;
        iVar24 = auVar18._4_4_;
        if (iVar24 <= iVar16 && (iVar24 != iVar16 || auVar18._0_4_ <= auVar20._0_4_)) {
          pwVar6[lVar13 + 2] = L'0';
          pwVar6[lVar13 + 3] = L'0';
        }
        lVar13 = lVar13 + 4;
      } while ((uVar12 - ((uint)uVar9 & 3)) + 4 != lVar13);
      return pwVar6 + uVar10;
    }
    uVar9 = (ulong)uVar5;
    uVar10 = uVar8 - 1;
    if ((int)uVar5 < (int)(uVar8 - 1)) {
      uVar10 = uVar5;
    }
    do {
      if (this->digits_[lVar13 + -1] != '0') {
        uVar10 = (uint)lVar13;
        break;
      }
      lVar13 = lVar13 + -1;
    } while ((long)uVar9 < lVar13);
    if (uVar10 != uVar5) {
      *it = this->decimal_point_;
      it = it + 1;
    }
    lVar13 = (long)(int)uVar10 - uVar9;
    if (lVar13 == 0 || (long)(int)uVar10 < (long)uVar9) {
      return it;
    }
    pcVar15 = this->digits_ + uVar9;
    uVar9 = lVar13 + 1;
    do {
      *it = (int)*pcVar15;
      pcVar15 = pcVar15 + 1;
      it = it + 1;
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
    return it;
  }
  *it = L'0';
  uVar10 = -uVar5;
  if (uVar8 == 0) {
    uVar8 = (this->specs_).precision;
    uVar11 = uVar10;
    if (SBORROW4(uVar8,uVar10) != (int)(uVar8 + uVar5) < 0) {
      uVar11 = uVar8;
    }
    if (-1 < (int)uVar8) {
      uVar10 = uVar11;
    }
  }
  else {
    if ((int)uVar8 < 1 || ((this->specs_).field_0x7 & 0x20) != 0) goto LAB_0180f4cf;
    do {
      uVar8 = (uint)uVar9;
      if (this->digits_[uVar9 - 1] != '0') goto LAB_0180f4cf;
      uVar9 = (ulong)(uVar8 - 1);
    } while (1 < (int)uVar8);
  }
  uVar8 = 0;
  if (uVar10 == 0) {
    return it + 1;
  }
LAB_0180f4cf:
  pwVar6 = it + 2;
  it[1] = this->decimal_point_;
  auVar4 = _DAT_01d9abd0;
  auVar3 = _DAT_01d99b10;
  auVar2 = _DAT_01d99b00;
  if (0 < (int)uVar10) {
    pwVar6 = pwVar6 + uVar10;
    uVar9 = (ulong)uVar10 + 0x3fffffffffffffff;
    uVar12 = uVar9 & 0x3fffffffffffffff;
    auVar21._8_4_ = (int)uVar12;
    auVar21._0_8_ = uVar12;
    auVar21._12_4_ = (int)(uVar12 >> 0x20);
    lVar13 = 0;
    auVar21 = auVar21 ^ _DAT_01d99b10;
    do {
      auVar31._8_4_ = (int)lVar13;
      auVar31._0_8_ = lVar13;
      auVar31._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar18 = (auVar31 | auVar2) ^ auVar3;
      iVar16 = auVar21._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar16 && auVar21._0_4_ < auVar18._0_4_ ||
                  iVar16 < auVar18._4_4_) & 1)) {
        it[lVar13 + 2] = L'0';
      }
      if ((auVar18._12_4_ != auVar21._12_4_ || auVar18._8_4_ <= auVar21._8_4_) &&
          auVar18._12_4_ <= auVar21._12_4_) {
        it[lVar13 + 3] = L'0';
      }
      auVar18 = (auVar31 | auVar4) ^ auVar3;
      iVar24 = auVar18._4_4_;
      if (iVar24 <= iVar16 && (iVar24 != iVar16 || auVar18._0_4_ <= auVar21._0_4_)) {
        it[lVar13 + 4] = L'0';
        it[lVar13 + 5] = L'0';
      }
      lVar13 = lVar13 + 4;
    } while ((uVar12 - ((uint)uVar9 & 3)) + 4 != lVar13);
  }
  if (0 < (int)uVar8) {
    pcVar15 = this->digits_;
    uVar9 = (ulong)uVar8 + 1;
    do {
      *pwVar6 = (int)*pcVar15;
      pcVar15 = pcVar15 + 1;
      pwVar6 = pwVar6 + 1;
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  return pwVar6;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }